

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

completion * __thiscall
mjs::interpreter::impl::operator()
          (completion *__return_storage_ptr__,impl *this,return_statement *s)

{
  expression *e;
  value res;
  value local_88;
  value local_60;
  value local_38;
  
  local_88.type_ = undefined;
  e = (s->e_)._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
      _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
      super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
  if (e != (expression *)0x0) {
    eval(&local_60,this,e);
    get_value(&local_38,this,&local_60);
    value::operator=(&local_88,&local_38);
    value::destroy(&local_38);
    value::destroy(&local_60);
  }
  completion::completion(__return_storage_ptr__,&local_88,return_);
  value::destroy(&local_88);
  return __return_storage_ptr__;
}

Assistant:

completion operator()(const return_statement& s) {
        value res{};
        if (s.e()) {
            res = get_value(eval(*s.e()));
        }
        return completion{res, completion_type::return_};
    }